

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QIntC.hh
# Opt level: O0

unsigned_long QIntC::IntConverter<long_long,_unsigned_long,_true,_false>::convert(longlong *i)

{
  ulong uVar1;
  unsigned_long uVar2;
  type ii;
  longlong *i_local;
  
  uVar1 = *i;
  if (-1 < *i) {
    uVar2 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 <= uVar2) goto LAB_00121396;
  }
  error(*i);
LAB_00121396:
  return *i;
}

Assistant:

inline static To
        convert(From const& i)
        {
            // From is signed, and To is unsigned. If i > 0, it's safe to
            // convert it to the corresponding unsigned type and to
            // compare with To's max.
            auto ii = static_cast<typename to_u<From>::type>(i);
            if ((i < 0) || (ii > std::numeric_limits<To>::max())) {
                error(i);
            }
            return static_cast<To>(i);
        }